

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64
drwav_read_pcm_frames_s16__ima(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  drwav_uint32 *pdVar4;
  size_t sVar5;
  drwav_uint64 dVar6;
  drwav_uint64 dVar7;
  drwav_int32 *pdVar8;
  int iVar9;
  int iVar10;
  drwav_uint32 *pdVar11;
  uint uVar12;
  drwav_uint32 dVar13;
  drwav_uint32 *pdVar14;
  long lVar15;
  ulong uVar16;
  drwav_uint16 dVar17;
  drwav_int32 dVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  drwav_uint64 dVar22;
  ulong uVar23;
  drwav_uint8 header [4];
  short local_70;
  byte local_6e;
  short local_6c;
  byte local_6a;
  drwav_uint64 local_68;
  drwav_uint64 local_60;
  drwav_int16 *local_58;
  drwav_uint32 *local_50;
  drwav_int32 *local_48;
  drwav_uint32 *local_40;
  long local_38;
  
  if (framesToRead == 0) {
    return 0;
  }
  pdVar14 = &(pWav->ima).cachedFrameCount;
  local_48 = (pWav->ima).cachedFrames;
  dVar22 = 0;
  do {
    if (pWav->totalPCMFrameCount <= (pWav->compressed).iCurrentPCMFrame) {
      return dVar22;
    }
    uVar12 = (pWav->ima).cachedFrameCount;
    if ((uVar12 == 0) && (uVar12 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_70,4);
        if (sVar5 != 4) {
          return dVar22;
        }
        dVar13 = (pWav->fmt).blockAlign - 4;
        (pWav->ima).bytesRemainingInBlock = dVar13;
        if (0x58 < local_6e) {
LAB_00106285:
          (*pWav->onSeek)(pWav->pUserData,dVar13,drwav_seek_origin_current);
          (pWav->ima).bytesRemainingInBlock = 0;
          return dVar22;
        }
        (pWav->ima).predictor[0] = (int)local_70;
        (pWav->ima).stepIndex[0] = (uint)local_6e;
        (pWav->ima).cachedFrames[0xf] = (int)local_70;
      }
      else {
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_70,8);
        if (sVar5 != 8) {
          return dVar22;
        }
        dVar13 = (pWav->fmt).blockAlign - 8;
        (pWav->ima).bytesRemainingInBlock = dVar13;
        if ((0x58 < local_6e) || (0x58 < local_6a)) goto LAB_00106285;
        (pWav->ima).predictor[0] = (int)local_70;
        (pWav->ima).stepIndex[0] = (uint)local_6e;
        (pWav->ima).predictor[1] = (int)local_6c;
        (pWav->ima).stepIndex[1] = (uint)local_6a;
        (pWav->ima).cachedFrames[0xe] = (int)local_70;
        (pWav->ima).cachedFrames[0xf] = (int)local_6c;
      }
      (pWav->ima).cachedFrameCount = 1;
      uVar12 = 1;
    }
    local_60 = framesToRead - uVar12;
    local_68 = uVar12 + dVar22;
    dVar6 = dVar22;
    dVar7 = framesToRead;
    while (uVar12 != 0) {
      uVar23 = (pWav->compressed).iCurrentPCMFrame;
      if (pWav->totalPCMFrameCount <= uVar23) goto LAB_0010624b;
      if (pBufferOut == (drwav_int16 *)0x0) {
        pBufferOut = (drwav_int16 *)0x0;
      }
      else {
        dVar17 = pWav->channels;
        if (dVar17 == 0) {
          uVar19 = 0;
        }
        else {
          uVar16 = 0;
          do {
            pBufferOut[uVar16] = (drwav_int16)pdVar14[uVar16 - dVar17 * uVar12];
            uVar16 = uVar16 + 1;
            dVar17 = pWav->channels;
            uVar19 = (ulong)dVar17;
          } while (uVar16 < uVar19);
        }
        pBufferOut = pBufferOut + uVar19;
      }
      dVar6 = dVar6 + 1;
      (pWav->compressed).iCurrentPCMFrame = uVar23 + 1;
      (pWav->ima).cachedFrameCount = uVar12 - 1;
      dVar7 = dVar7 - 1;
      uVar12 = uVar12 - 1;
      if (dVar7 == 0) {
        return framesToRead + dVar22;
      }
    }
    dVar6 = local_68;
    dVar7 = local_60;
    if (((pWav->ima).bytesRemainingInBlock != 0) &&
       ((pWav->ima).cachedFrameCount = 8, pWav->channels != 0)) {
      uVar23 = 0;
      pdVar4 = pdVar14;
      lVar15 = 0x10;
      local_58 = pBufferOut;
      local_50 = pdVar14;
      do {
        lVar21 = lVar15;
        pdVar11 = pdVar4;
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_70,4);
        if (sVar5 != 4) {
          (pWav->ima).cachedFrameCount = 0;
          return local_68;
        }
        (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
        uVar2 = pWav->channels;
        pdVar8 = local_48 + (ulong)uVar2 + lVar21;
        lVar15 = 0;
        pdVar14 = pdVar11;
        do {
          bVar1 = *(byte *)((long)&local_70 + lVar15);
          uVar20 = bVar1 & 0xf;
          iVar3 = (pWav->ima).stepIndex[uVar23];
          uVar12 = drwav_read_pcm_frames_s16__ima::stepTable[iVar3];
          iVar9 = ((int)(uVar20 << 0x1d) >> 0x1f & uVar12) +
                  ((int)uVar12 >> 1 & (int)(uVar20 << 0x1e) >> 0x1f) +
                  ((int)uVar12 >> 2 & -(bVar1 & 1)) + ((int)uVar12 >> 3);
          iVar10 = -iVar9;
          if ((byte)uVar20 < 8) {
            iVar10 = iVar9;
          }
          dVar13 = iVar10 + (pWav->ima).predictor[uVar23];
          if (0x7ffe < (int)dVar13) {
            dVar13 = 0x7fff;
          }
          if ((int)dVar13 < -0x7fff) {
            dVar13 = 0xffff8000;
          }
          (pWav->ima).predictor[uVar23] = dVar13;
          dVar18 = iVar3 + drwav_read_pcm_frames_s16__ima::indexTable[uVar20];
          if (0x57 < dVar18) {
            dVar18 = 0x58;
          }
          if (dVar18 < 1) {
            dVar18 = 0;
          }
          (pWav->ima).stepIndex[uVar23] = dVar18;
          pdVar14[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = dVar13;
          iVar3 = (pWav->ima).stepIndex[uVar23];
          uVar12 = drwav_read_pcm_frames_s16__ima::stepTable[iVar3];
          iVar9 = ((int)((uint)bVar1 << 0x19) >> 0x1f & uVar12) + ((int)uVar12 >> 3) +
                  ((int)uVar12 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                  ((int)uVar12 >> 1 & (int)((uint)bVar1 << 0x1a) >> 0x1f);
          iVar10 = -iVar9;
          if (-1 < (char)bVar1) {
            iVar10 = iVar9;
          }
          iVar10 = iVar10 + (pWav->ima).predictor[uVar23];
          if (0x7ffe < iVar10) {
            iVar10 = 0x7fff;
          }
          if (iVar10 < -0x7fff) {
            iVar10 = -0x8000;
          }
          (pWav->ima).predictor[uVar23] = iVar10;
          dVar18 = iVar3 + drwav_read_pcm_frames_s16__ima::indexTable[bVar1 >> 4];
          if (0x57 < dVar18) {
            dVar18 = 0x58;
          }
          if (dVar18 < 1) {
            dVar18 = 0;
          }
          (pWav->ima).stepIndex[uVar23] = dVar18;
          pdVar8[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = iVar10;
          lVar15 = lVar15 + 1;
          pdVar8 = (drwav_int32 *)((long)pdVar8 + (ulong)((uint)uVar2 * 8));
          pdVar14 = (drwav_uint32 *)((long)pdVar14 + (ulong)((uint)uVar2 * 8));
        } while (lVar15 != 4);
        uVar23 = uVar23 + 1;
        dVar6 = local_68;
        dVar7 = local_60;
        pBufferOut = local_58;
        pdVar4 = pdVar11 + 1;
        pdVar14 = local_50;
        lVar15 = lVar21 + 1;
        local_40 = pdVar11;
        local_38 = lVar21;
      } while (uVar23 < uVar2);
    }
LAB_0010624b:
    framesToRead = dVar7;
    dVar22 = dVar6;
    if (dVar7 == 0) {
      return dVar6;
    }
  } while( true );
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s16__ima(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 totalFramesRead = 0;
    drwav_uint32 iChannel;

    static drwav_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };

    static drwav_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17, 
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45, 
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118, 
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066, 
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899, 
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767 
    };

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(framesToRead > 0);

    /* TODO: Lots of room for optimization here. */

    while (framesToRead > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
        /* If there are no cached samples we need to load a new block. */
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                /* Mono. */
                drwav_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                /* Stereo. */
                drwav_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable) || header[6] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.predictor[1] = drwav__bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = header[6];

                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }

        /* Output anything that's cached. */
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                drwav_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (drwav_int16)pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }

            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->compressed.iCurrentPCMFrame += 1;
            pWav->ima.cachedFrameCount -= 1;
        }

        if (framesToRead == 0) {
            return totalFramesRead;
        }

        /*
        If there's nothing left in the cache, just go ahead and load more. If there's nothing left to load in the current block we just continue to the next
        loop iteration which will trigger the loading of a new block.
        */
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                /*
                From what I can tell with stereo streams, it looks like every 4 bytes (8 samples) is for one channel. So it goes 4 bytes for the
                left channel, 4 bytes for the right channel.
                */
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    drwav_uint32 iByte;
                    drwav_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;

                    for (iByte = 0; iByte < 4; ++iByte) {
                        drwav_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        drwav_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);

                        drwav_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        drwav_int32 predictor = pWav->ima.predictor[iChannel];

                        drwav_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;


                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];

                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }

    return totalFramesRead;
}